

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_int>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_int>_>
         *this)

{
  double *pdVar1;
  float fVar2;
  Precision PVar3;
  Samplings<vkt::shaderexecutor::InTypes<float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  Statement *pSVar4;
  ShaderExecutor *pSVar5;
  Variable<float> *pVVar6;
  pointer pcVar7;
  Variable<int> *pVVar8;
  pointer pfVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  uint uVar13;
  undefined8 uVar14;
  IVal *pIVar15;
  IVal *x;
  undefined8 *puVar16;
  size_t sVar17;
  long lVar18;
  IVal IVar19;
  FloatFormat *pFVar20;
  undefined1 auVar21 [8];
  long lVar22;
  TestStatus *pTVar23;
  double dVar24;
  double dVar25;
  FuncSet funcs;
  IVal in1;
  IVal in2;
  IVal in3;
  Environment env;
  EvalContext ctx;
  FloatFormat highpFmt;
  Outputs<vkt::shaderexecutor::OutTypes<float,_int>_> outputs;
  void *outputArr [2];
  Inputs<vkt::shaderexecutor::InTypes<float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  ostringstream oss;
  void *inputArr [4];
  ResultCollector status;
  uint in_stack_fffffffffffffa88;
  undefined4 uStack_574;
  undefined8 local_570;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_568;
  _Rb_tree_node_base *local_558;
  size_t local_550;
  string local_548;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_528;
  size_t local_520;
  ulong local_518;
  FloatFormat *local_510;
  IVal local_508;
  TestStatus *local_4f0;
  IVal local_4e8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_4c8;
  undefined1 local_498 [8];
  double dStack_490;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_488;
  double local_478;
  Precision local_470;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_468;
  undefined4 local_460;
  ios_base local_428 [8];
  ios_base local_420 [264];
  FloatFormat local_318;
  Outputs<vkt::shaderexecutor::OutTypes<float,_int>_> local_2e8;
  pointer local_2b8;
  pointer local_2b0;
  Inputs<vkt::shaderexecutor::InTypes<float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_2a0;
  IVal local_240;
  undefined4 uStack_228;
  undefined4 uStack_224;
  ios_base local_1d0 [264];
  pointer local_c8;
  pointer local_c0;
  pointer local_b8;
  pointer local_b0;
  _Base_ptr local_a8;
  undefined8 uStack_a0;
  double local_98;
  undefined8 uStack_90;
  ResultCollector local_80;
  
  this_00 = this->m_samplings;
  pFVar20 = &(this->m_caseCtx).floatFormat;
  PVar3 = (this->m_caseCtx).precision;
  sVar17 = (this->m_caseCtx).numRandoms;
  local_4f0 = __return_storage_ptr__;
  iVar12 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_510 = pFVar20;
  generateInputs<vkt::shaderexecutor::InTypes<float,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_2a0,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar20,(FloatFormat *)(ulong)PVar3,(Precision)sVar17,(ulong)(iVar12 + 0xdeadbeef),
             in_stack_fffffffffffffa88);
  pfVar9 = local_2a0.in0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar17 = (long)local_2a0.in0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_2a0.in0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start >> 2;
  Outputs<vkt::shaderexecutor::OutTypes<float,_int>_>::Outputs(&local_2e8,sVar17);
  local_318.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_318.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_318.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_318.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_318.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_318.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_318.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_318.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_318._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_4c8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_4c8._M_impl.super__Rb_tree_header._M_header;
  local_4c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_4c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_4c8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_4c8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_4c8._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_80);
  local_528 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_c8 = local_2a0.in0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_c0 = local_2a0.in1.
             super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_b8 = local_2a0.in2.
             super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_b0 = local_2a0.in3.
             super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_2b8 = local_2e8.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_2b0 = local_2e8.out1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_498 = (undefined1  [8])local_528;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_490);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81((ostringstream *)&dStack_490,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_490);
  std::ios_base::~ios_base(local_420);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_240);
  local_570 = (double)((ulong)local_570._4_4_ << 0x20);
  aStack_568._M_allocated_capacity = 0;
  local_550 = 0;
  pSVar4 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  aStack_568._8_8_ = (_Rb_tree_node_base *)&local_570;
  local_558 = (_Rb_tree_node_base *)&local_570;
  local_520 = sVar17;
  (*pSVar4->_vptr_Statement[4])(pSVar4,&stack0xfffffffffffffa88);
  if ((_Rb_tree_node_base *)aStack_568._8_8_ != (_Rb_tree_node_base *)&local_570) {
    uVar14 = aStack_568._8_8_;
    do {
      (**(code **)(**(long **)(uVar14 + 0x20) + 0x30))(*(long **)(uVar14 + 0x20),&local_240);
      uVar14 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar14);
    } while ((_Rb_tree_node_base *)uVar14 != (_Rb_tree_node_base *)&local_570);
  }
  pFVar20 = local_510;
  sVar17 = local_520;
  if (local_550 != 0) {
    local_498 = (undefined1  [8])local_528;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_490);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&dStack_490,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&dStack_490,local_548._M_dataplus._M_p,local_548._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_548._M_dataplus._M_p != &local_548.field_2) {
      operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_490);
    std::ios_base::~ios_base(local_420);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)&stack0xfffffffffffffa88);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_240);
  std::ios_base::~ios_base(local_1d0);
  pSVar5 = (this->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  (*pSVar5->_vptr_ShaderExecutor[2])(pSVar5,sVar17 & 0xffffffff,&local_c8,&local_2b8,0);
  local_498 = (undefined1  [8])((ulong)local_498 & 0xffffffffffffff00);
  dStack_490 = INFINITY;
  aStack_488._M_allocated_capacity = 0xfff0000000000000;
  local_240._0_8_ = local_240._0_8_ & 0xffffffffffffff00;
  local_240.m_lo = INFINITY;
  local_240.m_hi = -INFINITY;
  in_stack_fffffffffffffa88 = in_stack_fffffffffffffa88 & 0xffffff00;
  local_570 = INFINITY;
  aStack_568._M_allocated_capacity = 0xfff0000000000000;
  Environment::bind<float>
            ((Environment *)&local_4c8,
             (this->m_variables).in0.super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.
             m_ptr,(IVal *)local_498);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_4c8,
             (this->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_548);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_4c8,
             (this->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_508);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_4c8,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4e8);
  Environment::bind<float>
            ((Environment *)&local_4c8,
             (this->m_variables).out0.super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.
             m_ptr,&local_240);
  Environment::bind<int>
            ((Environment *)&local_4c8,
             (this->m_variables).out1.super_SharedPtr<const_vkt::shaderexecutor::Variable<int>_>.
             m_ptr,(IVal *)&stack0xfffffffffffffa88);
  if (local_2a0.in0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish == pfVar9) {
LAB_00993240:
    local_498 = (undefined1  [8])local_528;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_490);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"All ",4);
    pTVar23 = local_4f0;
    std::ostream::_M_insert<unsigned_long>((ulong)&dStack_490);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490," inputs passed.",0xf)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_490);
    std::ios_base::~ios_base(local_420);
    local_498 = (undefined1  [8])&aStack_488;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"Pass","");
    pTVar23->m_code = QP_TEST_RESULT_PASS;
    (pTVar23->m_description)._M_dataplus._M_p = (pointer)&(pTVar23->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar23->m_description,local_498,
               (char *)((long)local_498 + (long)dStack_490));
    uVar14 = aStack_488._M_allocated_capacity;
    auVar21 = local_498;
    if (local_498 == (undefined1  [8])&aStack_488) goto LAB_0099341c;
  }
  else {
    lVar18 = sVar17 + (sVar17 == 0);
    lVar22 = 0;
    local_518 = 0;
    do {
      local_508._0_8_ = local_508._0_8_ & 0xffffffffffffff00;
      local_508.m_lo = INFINITY;
      local_508.m_hi = -INFINITY;
      local_4e8._0_8_ = local_4e8._0_8_ & 0xffffffffffffff00;
      local_4e8.m_lo = INFINITY;
      local_4e8.m_hi = -INFINITY;
      dVar25 = (double)*(float *)((long)local_2a0.in0.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_start + lVar22);
      bVar10 = NAN(*(float *)((long)local_2a0.in0.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar22));
      local_498[0] = bVar10;
      dStack_490 = INFINITY;
      if (!bVar10) {
        dStack_490 = dVar25;
      }
      aStack_488._M_allocated_capacity = (size_type)-INFINITY;
      if (!bVar10) {
        aStack_488._M_allocated_capacity = (size_type)dVar25;
      }
      tcu::FloatFormat::roundOut
                ((Interval *)&stack0xfffffffffffffa88,pFVar20,(Interval *)local_498,false);
      tcu::FloatFormat::convert(&local_240,pFVar20,(Interval *)&stack0xfffffffffffffa88);
      pIVar15 = Environment::lookup<float>
                          ((Environment *)&local_4c8,
                           (this->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr);
      pIVar15->m_hi = local_240.m_hi;
      pIVar15->m_hasNaN = local_240.m_hasNaN;
      *(undefined7 *)&pIVar15->field_0x1 = local_240._1_7_;
      pIVar15->m_lo = local_240.m_lo;
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_4c8,
                 (this->m_variables).in1.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_4c8,
                 (this->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_4c8,
                 (this->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      local_470 = (this->m_caseCtx).precision;
      local_478 = pFVar20->m_maxValue;
      local_498 = *(undefined1 (*) [8])pFVar20;
      dStack_490 = *(double *)&pFVar20->m_fractionBits;
      aStack_488._M_allocated_capacity = *(undefined8 *)&pFVar20->m_hasInf;
      aStack_488._8_1_ = pFVar20->m_exactPrecision;
      aStack_488._9_7_ = *(undefined7 *)&pFVar20->field_0x19;
      local_460 = 0;
      pSVar4 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      local_468 = &local_4c8;
      (*pSVar4->_vptr_Statement[3])(pSVar4,(string *)local_498);
      x = Environment::lookup<int>
                    ((Environment *)&local_4c8,
                     (this->m_variables).out1.
                     super_SharedPtr<const_vkt::shaderexecutor::Variable<int>_>.m_ptr);
      tcu::FloatFormat::convert((Interval *)local_498,&local_318,x);
      local_4e8.m_hi = (double)aStack_488._M_allocated_capacity;
      local_4e8._0_8_ = local_498;
      local_4e8.m_lo = dStack_490;
      iVar12 = *(int *)((long)local_2e8.out1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar22);
      local_98 = dStack_490;
      uStack_90 = 0;
      local_a8 = (_Base_ptr)aStack_488._M_allocated_capacity;
      uStack_a0 = 0;
      local_498 = (undefined1  [8])&aStack_488;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_498,"Shader output 1 is outside acceptable range","");
      bVar10 = tcu::ResultCollector::check
                         (&local_80,
                          (bool)(-((double)iVar12 <= (double)local_a8) &
                                 -(local_98 <= (double)iVar12) & 1),(string *)local_498);
      if (local_498 != (undefined1  [8])&aStack_488) {
        operator_delete((void *)local_498,(ulong)(aStack_488._M_allocated_capacity + 1));
      }
      pIVar15 = Environment::lookup<float>
                          ((Environment *)&local_4c8,
                           (this->m_variables).out0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr);
      tcu::FloatFormat::convert((Interval *)local_498,&local_318,pIVar15);
      local_508.m_hi = (double)aStack_488._M_allocated_capacity;
      local_508._0_8_ = local_498;
      uVar14 = local_508._0_8_;
      local_508.m_lo = dStack_490;
      fVar2 = *(float *)((long)local_2e8.out0.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar22);
      dVar24 = (double)fVar2;
      dVar25 = dVar24;
      if (NAN(fVar2)) {
        dVar25 = INFINITY;
        dVar24 = -INFINITY;
      }
      IVar19 = (IVal)(dVar24 <= (double)aStack_488._M_allocated_capacity && dStack_490 <= dVar25);
      if ((NAN(fVar2)) &&
         (dVar24 <= (double)aStack_488._M_allocated_capacity && dStack_490 <= dVar25)) {
        local_508.m_hasNaN = local_498[0];
        IVar19 = (IVal)local_508.m_hasNaN;
      }
      local_498 = (undefined1  [8])&aStack_488;
      local_508._0_8_ = uVar14;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_498,"Shader output 0 is outside acceptable range","");
      bVar11 = tcu::ResultCollector::check(&local_80,(bool)((byte)IVar19 & 1),(string *)local_498);
      if (local_498 != (undefined1  [8])&aStack_488) {
        operator_delete((void *)local_498,(ulong)(aStack_488._M_allocated_capacity + 1));
      }
      pFVar20 = local_510;
      if ((!bVar10 || !bVar11) &&
         (uVar13 = (int)local_518 + 1, local_518 = (ulong)uVar13, (int)uVar13 < 0x65)) {
        local_498 = (undefined1  [8])local_528;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_490);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"Failed",6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"\t",1);
        pVVar6 = (this->m_variables).in0.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr;
        local_240._0_8_ = &local_240.m_hi;
        pcVar7 = (pVVar6->m_name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_240,pcVar7,pcVar7 + (pVVar6->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_490,(char *)local_240._0_8_,(long)local_240.m_lo);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490," = ",3);
        valueToString<float>
                  ((string *)&stack0xfffffffffffffa88,&local_318,
                   (float *)((long)local_2a0.in0.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar22));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_490,(char *)CONCAT44(uStack_574,in_stack_fffffffffffffa88),
                   (long)local_570);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(uStack_574,in_stack_fffffffffffffa88) != &aStack_568) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(uStack_574,in_stack_fffffffffffffa88),
                          (ulong)(aStack_568._M_allocated_capacity + 1));
        }
        if ((double *)local_240._0_8_ != &local_240.m_hi) {
          operator_delete((void *)local_240._0_8_,(long)local_240.m_hi + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"\t",1);
        pVVar6 = (this->m_variables).out0.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr;
        local_240._0_8_ = &local_240.m_hi;
        pcVar7 = (pVVar6->m_name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_240,pcVar7,pcVar7 + (pVVar6->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_490,(char *)local_240._0_8_,(long)local_240.m_lo);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490," = ",3);
        valueToString<float>
                  ((string *)&stack0xfffffffffffffa88,&local_318,
                   (float *)((long)local_2e8.out0.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar22));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_490,(char *)CONCAT44(uStack_574,in_stack_fffffffffffffa88),
                   (long)local_570);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_490,"\tExpected range: ",0x11);
        intervalToString<float>(&local_548,&local_318,&local_508);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_490,local_548._M_dataplus._M_p,local_548._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_548._M_dataplus._M_p != &local_548.field_2) {
          operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(uStack_574,in_stack_fffffffffffffa88) != &aStack_568) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(uStack_574,in_stack_fffffffffffffa88),
                          (ulong)(aStack_568._M_allocated_capacity + 1));
        }
        if ((double *)local_240._0_8_ != &local_240.m_hi) {
          operator_delete((void *)local_240._0_8_,(long)local_240.m_hi + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"\t",1);
        pVVar8 = (this->m_variables).out1.super_SharedPtr<const_vkt::shaderexecutor::Variable<int>_>
                 .m_ptr;
        local_240._0_8_ = &local_240.m_hi;
        pcVar7 = (pVVar8->m_name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_240,pcVar7,pcVar7 + (pVVar8->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_490,(char *)local_240._0_8_,(long)local_240.m_lo);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490," = ",3);
        valueToString<int>((string *)&stack0xfffffffffffffa88,&local_318,
                           (int *)((long)local_2e8.out1.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start + lVar22));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_490,(char *)CONCAT44(uStack_574,in_stack_fffffffffffffa88),
                   (long)local_570);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_490,"\tExpected range: ",0x11);
        intervalToString<int>(&local_548,&local_318,&local_4e8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_490,local_548._M_dataplus._M_p,local_548._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_548._M_dataplus._M_p != &local_548.field_2) {
          operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(uStack_574,in_stack_fffffffffffffa88) != &aStack_568) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(uStack_574,in_stack_fffffffffffffa88),
                          (ulong)(aStack_568._M_allocated_capacity + 1));
        }
        if ((double *)local_240._0_8_ != &local_240.m_hi) {
          operator_delete((void *)local_240._0_8_,(long)local_240.m_hi + 1);
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_490);
        std::ios_base::~ios_base(local_420);
      }
      lVar22 = lVar22 + 4;
      lVar18 = lVar18 + -1;
    } while (lVar18 != 0);
    iVar12 = (int)local_518;
    if (iVar12 < 0x65) {
      if (iVar12 == 0) goto LAB_00993240;
    }
    else {
      local_498 = (undefined1  [8])local_528;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_490);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"(Skipped ",9);
      std::ostream::operator<<((ostringstream *)&dStack_490,iVar12 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_490);
      std::ios_base::~ios_base(local_420);
    }
    local_498 = (undefined1  [8])local_528;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_490);
    std::ostream::operator<<((ostringstream *)&dStack_490,iVar12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)&dStack_490);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490," inputs failed.",0xf)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_490);
    std::ios_base::~ios_base(local_420);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
    std::ostream::operator<<(local_498,iVar12);
    pTVar23 = local_4f0;
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
    std::ios_base::~ios_base(local_428);
    local_498 = (undefined1  [8])&aStack_488;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_498," test failed. Check log for the details","");
    uVar14 = (_Base_ptr)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(uStack_574,in_stack_fffffffffffffa88) != &aStack_568) {
      uVar14 = aStack_568._M_allocated_capacity;
    }
    if ((ulong)uVar14 < (_Base_ptr)((long)dStack_490 + (long)local_570)) {
      uVar14 = (_Base_ptr)0xf;
      if (local_498 != (undefined1  [8])&aStack_488) {
        uVar14 = aStack_488._M_allocated_capacity;
      }
      if ((ulong)uVar14 < (_Base_ptr)((long)dStack_490 + (long)local_570)) goto LAB_00993233;
      puVar16 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)local_498,0,(char *)0x0,
                           CONCAT44(uStack_574,in_stack_fffffffffffffa88));
    }
    else {
LAB_00993233:
      puVar16 = (undefined8 *)
                std::__cxx11::string::_M_append(&stack0xfffffffffffffa88,(ulong)local_498);
    }
    pdVar1 = (double *)(puVar16 + 2);
    if ((double *)*puVar16 == pdVar1) {
      local_240.m_hi = *pdVar1;
      uStack_228 = *(undefined4 *)(puVar16 + 3);
      uStack_224 = *(undefined4 *)((long)puVar16 + 0x1c);
      local_240._0_8_ = &local_240.m_hi;
    }
    else {
      local_240.m_hi = *pdVar1;
      local_240._0_8_ = (double *)*puVar16;
    }
    local_240.m_lo = (double)puVar16[1];
    *puVar16 = pdVar1;
    puVar16[1] = 0;
    *(undefined1 *)pdVar1 = 0;
    pTVar23->m_code = QP_TEST_RESULT_FAIL;
    (pTVar23->m_description)._M_dataplus._M_p = (pointer)&(pTVar23->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar23->m_description,local_240._0_8_,
               (undefined1 *)((long)local_240.m_lo + local_240._0_8_));
    if ((double *)local_240._0_8_ != &local_240.m_hi) {
      operator_delete((void *)local_240._0_8_,(long)local_240.m_hi + 1);
    }
    if (local_498 != (undefined1  [8])&aStack_488) {
      operator_delete((void *)local_498,(ulong)(aStack_488._M_allocated_capacity + 1));
    }
    auVar21 = (undefined1  [8])CONCAT44(uStack_574,in_stack_fffffffffffffa88);
    uVar14 = aStack_568._M_allocated_capacity;
    if (auVar21 == (undefined1  [8])&aStack_568) goto LAB_0099341c;
  }
  operator_delete((void *)auVar21,(ulong)((long)&((_Base_ptr)uVar14)->_M_color + 1));
LAB_0099341c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_message._M_dataplus._M_p != &local_80.m_message.field_2) {
    operator_delete(local_80.m_message._M_dataplus._M_p,
                    local_80.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_prefix._M_dataplus._M_p != &local_80.m_prefix.field_2) {
    operator_delete(local_80.m_prefix._M_dataplus._M_p,
                    local_80.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_4c8);
  if (local_2e8.out1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2e8.out1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2e8.out1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.out1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2e8.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2e8.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2a0.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a0.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2a0.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a0.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2a0.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a0.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2a0.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a0.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2a0.in1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a0.in1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2a0.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a0.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2a0.in0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a0.in0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2a0.in0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a0.in0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return pTVar23;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}